

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clause.cpp
# Opt level: O0

string * __thiscall Kernel::Clause::toNiceString_abi_cxx11_(Clause *this)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  SplitSet *pSVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  SharedSet<unsigned_int> *in_stack_000000a8;
  string *result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  allocator<char> local_89;
  string local_88 [16];
  undefined8 in_stack_ffffffffffffff88;
  string local_68 [32];
  string local_48 [55];
  undefined1 local_11;
  
  local_11 = 0;
  literalsOnlyToString_abi_cxx11_((Clause *)in_stack_ffffffffffffff88);
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          splits((Clause *)0x842988);
  if (__lhs != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pSVar2 = splits((Clause *)0x8429a8);
    bVar1 = Lib::SharedSet<unsigned_int>::isEmpty(pSVar2);
    if (!bVar1) {
      __lhs_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_89;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff50,(char *)__lhs,(allocator<char> *)in_RSI);
      pSVar2 = splits((Clause *)0x8429fe);
      Lib::SharedSet<unsigned_int>::toString_abi_cxx11_(in_stack_000000a8);
      std::operator+(__lhs,in_RSI);
      std::operator+(__lhs_00,(char *)pSVar2);
      std::__cxx11::string::operator+=((string *)in_RDI,local_48);
      std::__cxx11::string::~string(local_48);
      std::__cxx11::string::~string(local_68);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff50);
      std::__cxx11::string::~string(local_88);
      std::allocator<char>::~allocator(&local_89);
    }
  }
  return in_RDI;
}

Assistant:

std::string Clause::toNiceString() const
{
  std::string result = literalsOnlyToString();

  if (splits() && !splits()->isEmpty()) {
    result += std::string(" {") + splits()->toString() + "}";
  }

  return result;
}